

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O1

void duckdb::PragmaQueries::RegisterFunction(BuiltinFunctions *set)

{
  pointer pcVar1;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  allocator_type local_1559;
  undefined1 local_1558 [48];
  string local_1528;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1508;
  LogicalType local_14e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_14d0;
  LogicalType local_14b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_14a0;
  LogicalType local_1488;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1470;
  LogicalType local_1458;
  LogicalType local_1440;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1428;
  LogicalType local_1410;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_13f8;
  PragmaFunction local_13e0;
  PragmaFunction local_12c8;
  PragmaFunction local_11b0;
  PragmaFunction local_1098;
  PragmaFunction local_f80;
  PragmaFunction local_e68;
  PragmaFunction local_d50;
  PragmaFunction local_c38;
  PragmaFunction local_b20;
  PragmaFunction local_a08;
  PragmaFunction local_8f0;
  PragmaFunction local_7d8;
  PragmaFunction local_6c0;
  PragmaFunction local_5a8;
  PragmaFunction local_490;
  PragmaFunction local_378;
  PragmaFunction local_260;
  PragmaFunction local_148;
  
  pcVar1 = local_1558 + 0x10;
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"table_info","");
  LogicalType::LogicalType((LogicalType *)&local_1528,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_13f8,__l,&local_1559);
  LogicalType::LogicalType(&local_1410,INVALID);
  PragmaFunction::PragmaCall
            (&local_148,(string *)local_1558,PragmaTableInfo_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_13f8,&local_1410);
  BuiltinFunctions::AddFunction(set,&local_148);
  local_148.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_148.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_148.super_SimpleNamedParameterFunction);
  LogicalType::~LogicalType(&local_1410);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_13f8);
  LogicalType::~LogicalType((LogicalType *)&local_1528);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"storage_info","");
  LogicalType::LogicalType((LogicalType *)&local_1528,VARCHAR);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_1528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1428,__l_00,&local_1559);
  LogicalType::LogicalType(&local_1440,INVALID);
  PragmaFunction::PragmaCall
            (&local_260,(string *)local_1558,PragmaStorageInfo_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_1428,&local_1440);
  BuiltinFunctions::AddFunction(set,&local_260);
  local_260.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_260.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_260.super_SimpleNamedParameterFunction);
  LogicalType::~LogicalType(&local_1440);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1428);
  LogicalType::~LogicalType((LogicalType *)&local_1528);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"metadata_info","");
  local_1508.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1508.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1508.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_1458,INVALID);
  PragmaFunction::PragmaCall
            (&local_378,(string *)local_1558,PragmaMetadataInfo_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_1508,&local_1458);
  BuiltinFunctions::AddFunction(set,&local_378);
  local_378.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_378.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_378.super_SimpleNamedParameterFunction);
  LogicalType::~LogicalType(&local_1458);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1508);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"show_tables","");
  PragmaFunction::PragmaStatement(&local_490,(string *)local_1558,PragmaShowTables_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_490);
  local_490.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_490.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_490.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"show_tables_expanded","");
  PragmaFunction::PragmaStatement
            (&local_5a8,(string *)local_1558,PragmaShowTablesExpanded_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_5a8);
  local_5a8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_5a8.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_5a8.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"show_databases","");
  PragmaFunction::PragmaStatement(&local_6c0,(string *)local_1558,PragmaShowDatabases_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_6c0);
  local_6c0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_6c0.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_6c0.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"database_list","");
  PragmaFunction::PragmaStatement(&local_7d8,(string *)local_1558,PragmaDatabaseList_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_7d8);
  local_7d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_7d8.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_7d8.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"collations","");
  PragmaFunction::PragmaStatement(&local_8f0,(string *)local_1558,PragmaCollations_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_8f0);
  local_8f0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_8f0.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_8f0.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"show","");
  LogicalType::LogicalType((LogicalType *)&local_1528,VARCHAR);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1470,__l_01,&local_1559);
  LogicalType::LogicalType(&local_1488,INVALID);
  PragmaFunction::PragmaCall
            (&local_a08,(string *)local_1558,PragmaShow_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_1470,&local_1488);
  BuiltinFunctions::AddFunction(set,&local_a08);
  local_a08.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a08.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_a08.super_SimpleNamedParameterFunction);
  LogicalType::~LogicalType(&local_1488);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1470);
  LogicalType::~LogicalType((LogicalType *)&local_1528);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"version","");
  PragmaFunction::PragmaStatement(&local_b20,(string *)local_1558,PragmaVersion_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_b20);
  local_b20.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b20.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_b20.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"extension_versions","");
  PragmaFunction::PragmaStatement
            (&local_c38,(string *)local_1558,PragmaExtensionVersions_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_c38);
  local_c38.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c38.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_c38.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"platform","");
  PragmaFunction::PragmaStatement(&local_d50,(string *)local_1558,PragmaPlatform_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_d50);
  local_d50.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_d50.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_d50.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"database_size","");
  PragmaFunction::PragmaStatement(&local_e68,(string *)local_1558,PragmaDatabaseSize_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_e68);
  local_e68.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e68.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_e68.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"functions","");
  PragmaFunction::PragmaStatement(&local_f80,(string *)local_1558,PragmaFunctionsQuery_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_f80);
  local_f80.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f80.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_f80.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"import_database","");
  LogicalType::LogicalType((LogicalType *)&local_1528,VARCHAR);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_14a0,__l_02,&local_1559);
  LogicalType::LogicalType(&local_14b8,INVALID);
  PragmaFunction::PragmaCall
            (&local_1098,(string *)local_1558,PragmaImportDatabase_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_14a0,&local_14b8);
  BuiltinFunctions::AddFunction(set,&local_1098);
  local_1098.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1098.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1098.super_SimpleNamedParameterFunction);
  LogicalType::~LogicalType(&local_14b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_14a0);
  LogicalType::~LogicalType((LogicalType *)&local_1528);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1528._M_dataplus._M_p = (pointer)&local_1528.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1528,"copy_database","");
  LogicalType::LogicalType((LogicalType *)local_1558,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_1558 + 0x18),VARCHAR);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_1558;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_14d0,__l_03,&local_1559);
  LogicalType::LogicalType(&local_14e8,INVALID);
  PragmaFunction::PragmaCall
            (&local_11b0,&local_1528,PragmaCopyDatabase_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_14d0,&local_14e8);
  BuiltinFunctions::AddFunction(set,&local_11b0);
  local_11b0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_11b0.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_11b0.super_SimpleNamedParameterFunction);
  LogicalType::~LogicalType(&local_14e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_14d0);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1558 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1528._M_dataplus._M_p != &local_1528.field_2) {
    operator_delete(local_1528._M_dataplus._M_p);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"all_profiling_output","");
  PragmaFunction::PragmaStatement(&local_12c8,(string *)local_1558,PragmaAllProfiling_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_12c8);
  local_12c8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_12c8.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_12c8.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  local_1558._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"user_agent","");
  PragmaFunction::PragmaStatement(&local_13e0,(string *)local_1558,PragmaUserAgent_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_13e0);
  local_13e0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02485510;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_13e0.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_13e0.super_SimpleNamedParameterFunction);
  if ((pointer)local_1558._0_8_ != pcVar1) {
    operator_delete((void *)local_1558._0_8_);
  }
  return;
}

Assistant:

void PragmaQueries::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(PragmaFunction::PragmaCall("table_info", PragmaTableInfo, {LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaCall("storage_info", PragmaStorageInfo, {LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaCall("metadata_info", PragmaMetadataInfo, {}));
	set.AddFunction(PragmaFunction::PragmaStatement("show_tables", PragmaShowTables));
	set.AddFunction(PragmaFunction::PragmaStatement("show_tables_expanded", PragmaShowTablesExpanded));
	set.AddFunction(PragmaFunction::PragmaStatement("show_databases", PragmaShowDatabases));
	set.AddFunction(PragmaFunction::PragmaStatement("database_list", PragmaDatabaseList));
	set.AddFunction(PragmaFunction::PragmaStatement("collations", PragmaCollations));
	set.AddFunction(PragmaFunction::PragmaCall("show", PragmaShow, {LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaStatement("version", PragmaVersion));
	set.AddFunction(PragmaFunction::PragmaStatement("extension_versions", PragmaExtensionVersions));
	set.AddFunction(PragmaFunction::PragmaStatement("platform", PragmaPlatform));
	set.AddFunction(PragmaFunction::PragmaStatement("database_size", PragmaDatabaseSize));
	set.AddFunction(PragmaFunction::PragmaStatement("functions", PragmaFunctionsQuery));
	set.AddFunction(PragmaFunction::PragmaCall("import_database", PragmaImportDatabase, {LogicalType::VARCHAR}));
	set.AddFunction(
	    PragmaFunction::PragmaCall("copy_database", PragmaCopyDatabase, {LogicalType::VARCHAR, LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaStatement("all_profiling_output", PragmaAllProfiling));
	set.AddFunction(PragmaFunction::PragmaStatement("user_agent", PragmaUserAgent));
}